

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O1

int Abc_NtkCountInst_rec(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  Abc_Ntk_t *pNtk_00;
  int iVar4;
  Vec_Ptr_t *__ptr;
  int iVar5;
  long lVar6;
  
  iVar5 = pNtk->iStep;
  if (iVar5 < 0) {
    __ptr = Abc_NtkDfsBoxes(pNtk);
    iVar1 = __ptr->nSize;
    if ((long)iVar1 < 1) {
      iVar5 = 1;
    }
    else {
      ppvVar3 = __ptr->pArray;
      lVar6 = 0;
      iVar5 = 0;
      do {
        uVar2 = *(uint *)((long)ppvVar3[lVar6] + 0x14);
        if (((uVar2 & 0xe) == 8 || (uVar2 & 0xf) == 10) &&
           (pNtk_00 = *(Abc_Ntk_t **)((long)ppvVar3[lVar6] + 0x38), pNtk_00 != pNtk)) {
          iVar4 = Abc_NtkCountInst_rec(pNtk_00);
          iVar5 = iVar5 + iVar4;
        }
        lVar6 = lVar6 + 1;
      } while (iVar1 != lVar6);
      iVar5 = iVar5 + 1;
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    if (__ptr != (Vec_Ptr_t *)0x0) {
      free(__ptr);
    }
    pNtk->iStep = iVar5;
  }
  return iVar5;
}

Assistant:

int Abc_NtkCountInst_rec( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vOrder;
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    if ( pNtk->iStep >= 0 )
        return pNtk->iStep;
    vOrder = Abc_NtkDfsBoxes( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
        if ( Abc_ObjIsBox(pObj) && (Abc_Ntk_t *)pObj->pData != pNtk )
            Counter += Abc_NtkCountInst_rec( (Abc_Ntk_t *)pObj->pData );
    Vec_PtrFree( vOrder );
    return pNtk->iStep = 1 + Counter;
}